

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Vector * __thiscall Matrix::operator*(Vector *__return_storage_ptr__,Matrix *this,Vector *other)

{
  runtime_error *this_00;
  long lVar1;
  double dVar2;
  allocator_type local_49;
  void *local_48 [2];
  long local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)this->rows,(allocator_type *)local_48);
  if ((long)(other->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(other->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->cols) {
    if (0 < this->rows) {
      lVar1 = 0;
      do {
        std::vector<double,std::allocator<double>>::vector<double*,void>
                  ((vector<double,std::allocator<double>> *)local_48,
                   this->data + (long)(int)lVar1 * (long)this->cols,
                   this->data + (long)(int)lVar1 * (long)this->cols + this->cols,&local_49);
        dVar2 = Utils::ScalarMultiply((Vector *)local_48,other);
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar1] = dVar2;
        if (local_48[0] != (void *)0x0) {
          operator_delete(local_48[0],local_38 - (long)local_48[0]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->rows);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vector Matrix::operator*(const Vector& other) const
{
    Vector product = Vector(rows);

    if (other.size() != cols)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    for (int i = 0; i < rows; ++i)
    {
        product[i] = Utils::ScalarMultiply(GetRow(i), other);
    }

    return product;
}